

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffglkut(fitsfile *fptr,char *keyname,int firstchar,int maxvalchar,int maxcomchar,char *value,
           int *valuelen,char *comm,int *comlen,int *status)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  char *in_R9;
  size_t lenc;
  size_t len;
  undefined4 *in_stack_00000018;
  int savedKeyPos;
  int lenOnly;
  int keynum;
  int addCommDelim;
  int contin;
  char *dynComStr;
  char *dynValStr;
  char card [81];
  char comstring [73];
  char valstring [71];
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  undefined1 uVar4;
  int *piVar5;
  fitsfile *pfVar6;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  char *local_138;
  char *local_130;
  char local_128 [72];
  int *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char cVar10;
  undefined7 in_stack_ffffffffffffff39;
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  char local_78 [40];
  int *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  int local_4;
  
  bVar1 = false;
  uVar9 = 0;
  iVar8 = 0;
  iVar7 = 1;
  pfVar6 = (fitsfile *)0x0;
  piVar5 = (int *)0x0;
  if (*_lenOnly < 1) {
    if ((in_ECX == 0) && (in_R8D == 0)) {
      iVar8 = 1;
    }
    if (in_R9 != (char *)0x0) {
      *in_R9 = '\0';
    }
    if (len != 0) {
      *(undefined1 *)len = 0;
    }
    *(undefined4 *)lenc = 0;
    *in_stack_00000018 = 0;
    local_128[0] = '\0';
    local_78[0] = '\0';
    cVar10 = '\0';
    ffgcrd(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
           in_stack_ffffffffffffffb0);
    if (*_lenOnly < 1) {
      ffpsvc((char *)CONCAT71(in_stack_ffffffffffffff39,cVar10),in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (*_lenOnly < 1) {
        sVar3 = strlen(local_128);
        if ((sVar3 < 0x50) && (cVar10 != '\0')) {
          bVar1 = true;
        }
        if ((iVar8 != 0) &&
           (ffghps(pfVar6,piVar5,
                   (int *)CONCAT17(in_stack_fffffffffffffe9f,
                                   CONCAT16(in_stack_fffffffffffffe9e,
                                            CONCAT24(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98))),(int *)0x1ca7b9),
           1 < iVar7)) {
          iVar7 = iVar7 + -1;
        }
        if (local_78[0] == '\0') {
          local_130 = (char *)malloc(1);
          *local_130 = '\0';
          local_138 = (char *)malloc(1);
          *local_138 = '\0';
        }
        else {
          sVar3 = strlen(local_78);
          local_130 = (char *)malloc(sVar3 + 1);
          ffc2s((char *)CONCAT44(uVar9,iVar8),(char *)CONCAT44(iVar7,in_stack_fffffffffffffeb0),
                &pfVar6->HDUposition);
          pfVar6 = (fitsfile *)strlen(local_130);
          sVar3 = strlen(&stack0xffffffffffffff38);
          local_138 = (char *)malloc(sVar3 + 1);
          *local_138 = '\0';
          strcpy(local_138,&stack0xffffffffffffff38);
          piVar5 = (int *)strlen(local_138);
          bVar2 = true;
          while( true ) {
            uVar4 = false;
            if (bVar2) {
              uVar4 = *_lenOnly < 1;
            }
            if ((bool)uVar4 == false) break;
            if ((pfVar6 == (fitsfile *)0x0) || ((local_130 + -1)[(long)pfVar6] != '&')) {
              bVar2 = false;
            }
            else {
              local_78[0] = '\0';
              cVar10 = '\0';
              ffgcnt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40);
              if ((local_78[0] == '\0') && (cVar10 == '\0')) {
                bVar2 = false;
              }
              else {
                (local_130 + -1)[(long)pfVar6] = '\0';
                pfVar6 = (fitsfile *)((long)&pfVar6[-1].Fptr + 7);
                if (local_78[0] != '\0') {
                  sVar3 = strlen(local_78);
                  pfVar6 = (fitsfile *)((long)&pfVar6->HDUposition + sVar3);
                  local_130 = (char *)realloc(local_130,(size_t)((long)&pfVar6->HDUposition + 1));
                  strcat(local_130,local_78);
                }
                if (cVar10 != '\0') {
                  if (bVar1) {
                    sVar3 = strlen(&stack0xffffffffffffff38);
                    piVar5 = (int *)(sVar3 + 1 + (long)piVar5);
                    local_138 = (char *)realloc(local_138,(long)piVar5 + 1);
                    strcat(local_138," ");
                    strcat(local_138,&stack0xffffffffffffff38);
                  }
                  else {
                    sVar3 = strlen(&stack0xffffffffffffff38);
                    piVar5 = (int *)(sVar3 + (long)piVar5);
                    local_138 = (char *)realloc(local_138,(long)piVar5 + 1);
                    strcat(local_138,&stack0xffffffffffffff38);
                  }
                }
                ffghps(pfVar6,piVar5,
                       (int *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe9e,
                                                      CONCAT24(in_stack_fffffffffffffe9c,
                                                               in_stack_fffffffffffffe98))),
                       (int *)0x1caa79);
                ffgrec(pfVar6,(int)((ulong)piVar5 >> 0x20),
                       (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe9e,
                                                       CONCAT24(in_stack_fffffffffffffe9c,
                                                                in_stack_fffffffffffffe98))),
                       (int *)0x1caa9a);
                sVar3 = strlen(local_128);
                in_stack_fffffffffffffe9e = sVar3 < 0x50 && piVar5 != (int *)0x0;
                bVar1 = sVar3 < 0x50 && piVar5 != (int *)0x0;
              }
            }
          }
          in_stack_fffffffffffffe9f = 0;
        }
        sVar3 = strlen(local_130);
        pfVar6 = (fitsfile *)strlen(local_138);
        *(int *)lenc = (int)sVar3;
        *in_stack_00000018 = (int)pfVar6;
        if (iVar8 == 0) {
          if ((in_R9 != (char *)0x0) && ((ulong)(long)in_EDX <= sVar3)) {
            strncat(in_R9,local_130 + (long)in_EDX + -1,(long)in_ECX);
          }
          if (len != 0) {
            strncat((char *)len,local_138,(long)in_R8D);
          }
        }
        else {
          ffmaky(pfVar6,CONCAT13(in_stack_fffffffffffffe9f,
                                 CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)),
                 (int *)0x1cab50);
        }
        free(local_130);
        free(local_138);
        local_4 = *_lenOnly;
      }
      else {
        local_4 = *_lenOnly;
      }
    }
    else {
      local_4 = *_lenOnly;
    }
  }
  else {
    local_4 = *_lenOnly;
  }
  return local_4;
}

Assistant:

int ffglkut( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxvalchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           int maxcomchar,      /* I - maximum length of comment to return */
           char *value,         /* O - pointer to keyword value (may be NULL) */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxvalchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int *comlen,         /* O - total length of comment string */
           int  *status)        /* IO - error status                 */
{
    char valstring[FLEN_VALUE], comstring[FLEN_COMMENT], card[FLEN_CARD];
    char *dynValStr=0, *dynComStr=0;
    int contin, addCommDelim=0, keynum=0;
    int lenOnly=0, savedKeyPos=1;
    size_t len=0, lenc=0;

    if (*status > 0)
        return(*status);

    if (maxvalchar==0 && maxcomchar==0)
       lenOnly = 1;
    
    if (value)
       *value = '\0';
    if (comm)
       *comm = '\0';
    /* If lenOnly, 'value' and 'comm' should not be accessed after this point.*/
    
    *valuelen = 0; 
    *comlen = 0;   
    card[0] = '\0';
    valstring[0] = '\0';
    comstring[0] = '\0';
       
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    ffpsvc(card,valstring, comstring, status);    
    if (*status > 0)
        return(*status);
    if (strlen(card) < FLEN_CARD-1 && *comstring)
       addCommDelim=1;
        
    /* If called in lenOnly mode, there's a good chance the user will soon call
       this again to read the value string.  Therefore we'll save and later restore
       the original keyword position. */
    if (lenOnly)
    {
       ffghps(fptr, 0, &savedKeyPos, status);
       if (savedKeyPos > 1)
          savedKeyPos -= 1;
    }

    if (!valstring[0])   /* null value string? */
    {
      dynValStr = (char *) malloc(1);  /* allocate and return a null string */
      *dynValStr = '\0';      
      dynComStr = (char *)malloc(1);
      *dynComStr= '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      dynValStr = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, dynValStr, status);   /* convert string to value */
      len = strlen(dynValStr);
      
      dynComStr = (char *) malloc(strlen(comstring)+1);
      dynComStr[0]=0;
      strcpy(dynComStr, comstring);
      lenc = strlen(dynComStr);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(dynValStr+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            comstring[0] = '\0';
            ffgcnt(fptr, valstring, comstring, status);
            if (*valstring || *comstring)  /* If either valstring or comstring
                                  is filled, this must be a CONTINUE line */  
            {
               *(dynValStr+len-1) = '\0';         /* erase the trailing & char */
               len -= 1;
               if (*valstring)
               {
                  len += strlen(valstring);
                  dynValStr = (char *) realloc(dynValStr, len + 1); /* increase size */
                  strcat(dynValStr, valstring);     /* append the continued chars */
               }
               if (*comstring)
               {
                  /* concantenate comment strings */
                  if (addCommDelim)
                  {
                     lenc += strlen(comstring) + 1;
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, " ");
                     strcat(dynComStr, comstring);
                  }
                  else
                  {
                     lenc += strlen(comstring);
                     dynComStr = (char *) realloc(dynComStr, lenc + 1);
                     strcat(dynComStr, comstring);                     
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = ((strlen(card) < FLEN_CARD-1) && lenc) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    /* Resetting len and lenc really shouldn't be necessary here, but
       just to make sure ... */
    len = strlen(dynValStr);
    lenc = strlen(dynComStr);
    *valuelen = len;
    *comlen = lenc;
    if (lenOnly)
       ffmaky(fptr, savedKeyPos, status);
    else
    {
       if (value)
       {
          if (firstchar <= len)
             strncat(value,dynValStr+firstchar-1,maxvalchar);
       }
       if (comm)
       {
          strncat(comm,dynComStr,maxcomchar);
       }
    }
    
    free(dynValStr);
    free(dynComStr);
        
    return(*status);
}